

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_1a3010::GetAndNumberControlGraphNodesDfs
               (SmallArray<VmBlock_*,_32U> *blocksPostOrder,VmBlock *block,uint *preOrder,
               uint *postOrder)

{
  uint uVar1;
  VmBlock **ppVVar2;
  VmBlock *successor;
  uint i;
  uint *postOrder_local;
  uint *preOrder_local;
  VmBlock *block_local;
  SmallArray<VmBlock_*,_32U> *blocksPostOrder_local;
  
  uVar1 = *preOrder;
  *preOrder = uVar1 + 1;
  block->controlGraphPreOrderId = uVar1;
  block->visited = true;
  successor._4_4_ = 0;
  preOrder_local = (uint *)block;
  block_local = (VmBlock *)blocksPostOrder;
  while( true ) {
    uVar1 = SmallArray<VmBlock_*,_4U>::size((SmallArray<VmBlock_*,_4U> *)(preOrder_local + 0x48));
    if (uVar1 <= successor._4_4_) break;
    ppVVar2 = SmallArray<VmBlock_*,_4U>::operator[]
                        ((SmallArray<VmBlock_*,_4U> *)(preOrder_local + 0x48),successor._4_4_);
    if (((*ppVVar2)->visited & 1U) == 0) {
      GetAndNumberControlGraphNodesDfs
                ((SmallArray<VmBlock_*,_32U> *)block_local,*ppVVar2,preOrder,postOrder);
    }
    successor._4_4_ = successor._4_4_ + 1;
  }
  uVar1 = *postOrder;
  *postOrder = uVar1 + 1;
  preOrder_local[0x58] = uVar1;
  SmallArray<VmBlock_*,_32U>::push_back
            ((SmallArray<VmBlock_*,_32U> *)block_local,(VmBlock **)&preOrder_local);
  return;
}

Assistant:

void GetAndNumberControlGraphNodesDfs(SmallArray<VmBlock*, 32>& blocksPostOrder, VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->controlGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->successors.size(); i++)
		{
			VmBlock *successor = block->successors[i];

			if(!successor->visited)
				GetAndNumberControlGraphNodesDfs(blocksPostOrder, successor, preOrder, postOrder);
		}

		block->controlGraphPostOrderId = postOrder++;

		blocksPostOrder.push_back(block);
	}